

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btGeneric6DofConstraint.cpp
# Opt level: O0

bool __thiscall
btGeneric6DofConstraint::testAngularLimitMotor(btGeneric6DofConstraint *this,int axis_index)

{
  bool bVar1;
  int in_ESI;
  long in_RDI;
  btScalar test_value;
  btScalar unaff_retaddr;
  btScalar angle;
  long lVar2;
  
  lVar2 = in_RDI;
  btVector3::operator_cast_to_float_((btVector3 *)(in_RDI + 0x4c0));
  test_value = btAdjustAngleToLimits(unaff_retaddr,(btScalar)((ulong)lVar2 >> 0x20),(btScalar)lVar2)
  ;
  *(btScalar *)(in_RDI + (long)in_ESI * 0x40 + 0x3b0) = test_value;
  btRotationalLimitMotor::testLimitValue
            ((btRotationalLimitMotor *)(in_RDI + 0x37c + (long)in_ESI * 0x40),test_value);
  bVar1 = btRotationalLimitMotor::needApplyTorques
                    ((btRotationalLimitMotor *)(in_RDI + 0x37c + (long)in_ESI * 0x40));
  return bVar1;
}

Assistant:

bool btGeneric6DofConstraint::testAngularLimitMotor(int axis_index)
{
	btScalar angle = m_calculatedAxisAngleDiff[axis_index];
	angle = btAdjustAngleToLimits(angle, m_angularLimits[axis_index].m_loLimit, m_angularLimits[axis_index].m_hiLimit);
	m_angularLimits[axis_index].m_currentPosition = angle;
	//test limits
	m_angularLimits[axis_index].testLimitValue(angle);
	return m_angularLimits[axis_index].needApplyTorques();
}